

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_SimdLdArrConstIndex<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  byte dataWidth;
  ushort uVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 *puVar8;
  JavascriptArrayBuffer *pJVar9;
  undefined4 extraout_var;
  long lVar10;
  SIMDValue SVar11;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2049,"(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT)",
                                "playout->ViewType < Js::ArrayBufferView::TYPE_COUNT");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  uVar2 = playout->SlotIndex;
  pJVar9 = GetAsmJsBuffer(this);
  iVar6 = (*(pJVar9->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x72])(pJVar9);
  dataWidth = playout->DataWidth;
  uVar1 = playout->Value;
  uVar7 = (*(pJVar9->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])(pJVar9);
  if ((ulong)uVar2 + (ulong)dataWidth <= (ulong)uVar7) {
    SVar11 = SIMDUtils::SIMDLdData
                       ((SIMDValue *)(CONCAT44(extraout_var,iVar6) + (ulong)uVar2),dataWidth);
    lVar3 = *(long *)(this + 0x148);
    lVar10 = (ulong)uVar1 * 0x10;
    *(long *)(lVar3 + lVar10) = SVar11.field_0._0_8_;
    *(long *)(lVar3 + 8 + lVar10) = SVar11.field_0._8_8_;
    return;
  }
  JavascriptError::ThrowRangeError
            (*(ScriptContext **)(this + 0x78),-0x7ff5ebf6,L"Simd typed array access");
}

Assistant:

void InterpreterStackFrame::OP_SimdLdArrConstIndex(const unaligned T* playout)
    {
        Assert(playout->ViewType < Js::ArrayBufferView::TYPE_COUNT);
        const uint64 index = (uint32)playout->SlotIndex;
        JavascriptArrayBuffer* arr = GetAsmJsBuffer();
        BYTE* buffer = arr->GetBuffer();
        uint8 dataWidth = playout->DataWidth;
        RegSlot dstReg = playout->Value;

        if (index + dataWidth > arr->GetByteLength())
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange, _u("Simd typed array access"));
        }
        AsmJsSIMDValue *data = (AsmJsSIMDValue*)(buffer + index);
        AsmJsSIMDValue value;

        value = SIMDUtils::SIMDLdData(data, dataWidth);
        SetRegRawSimd(dstReg, value);
    }